

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O2

bool __thiscall Analyzer::nodeCannotBeNull(Analyzer *this,Node *n)

{
  TokenType TVar1;
  ulong uVar2;
  
  uVar2 = (ulong)n->nodeType;
  if (uVar2 < 0x36) {
    if ((0x3003800600603cU >> (uVar2 & 0x3f) & 1) != 0) {
      return true;
    }
    if (uVar2 == 0xf) {
      TVar1 = n->tok->type;
      return TVar1 != TK_MODULO && TVar1 != TK_NULLCOALESCE;
    }
  }
  return false;
}

Assistant:

bool nodeCannotBeNull(Node * n)
  {
    return (n->nodeType == PNT_BINARY_OP && n->tok.type != TK_NULLCOALESCE && n->tok.type != TK_MODULO) ||
        n->nodeType == PNT_UNARY_PRE_OP || n->nodeType == PNT_UNARY_POST_OP ||
        n->nodeType == PNT_INTEGER || n->nodeType == PNT_BOOL || n->nodeType == PNT_FLOAT ||
        n->nodeType == PNT_STRING || n->nodeType == PNT_ARRAY_CREATION ||
        n->nodeType == PNT_TABLE_CREATION || n->nodeType == PNT_LAMBDA || n->nodeType == PNT_FUNCTION ||
        n->nodeType == PNT_LOCAL_FUNCTION || n->nodeType == PNT_CLASS || n->nodeType == PNT_LOCAL_CLASS;
  }